

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadSmallSpanSequence
          (ByteCodeBufferReader *this,byte *current,SmallSpanSequence **smallSpanSequence)

{
  HeapAllocator *alloc;
  SmallSpanSequence *this_00;
  byte *pbVar1;
  TrackAllocData local_48;
  SmallSpanSequence **local_20;
  SmallSpanSequence **smallSpanSequence_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  local_20 = smallSpanSequence;
  smallSpanSequence_local = (SmallSpanSequence **)current;
  current_local = (byte *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&SmallSpanSequence::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
             ,0xe6b);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  this_00 = (SmallSpanSequence *)new<Memory::HeapAllocator>(0x18,alloc,0x350bd0);
  SmallSpanSequence::SmallSpanSequence(this_00);
  *local_20 = this_00;
  smallSpanSequence_local =
       (SmallSpanSequence **)ReadInt32(this,(byte *)smallSpanSequence_local,&(*local_20)->baseValue)
  ;
  smallSpanSequence_local =
       (SmallSpanSequence **)
       ReadGrowingUint32Array(this,(byte *)smallSpanSequence_local,&(*local_20)->pStatementBuffer);
  pbVar1 = ReadGrowingUint32Array
                     (this,(byte *)smallSpanSequence_local,&(*local_20)->pActualOffsetList);
  return pbVar1;
}

Assistant:

const byte * ReadSmallSpanSequence(const byte * current, SmallSpanSequence ** smallSpanSequence)
    {
        (*smallSpanSequence) = HeapNew(SmallSpanSequence);
        current = ReadInt32(current, &(*smallSpanSequence)->baseValue);
        current = ReadGrowingUint32Array(current, &(*smallSpanSequence)->pStatementBuffer); // CONSIDER: It would be really nice to change GrowingUint32Array to something with a fixed, readonly layout
        current = ReadGrowingUint32Array(current, &(*smallSpanSequence)->pActualOffsetList);
        return current;
    }